

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall asmjit::_abi_1_10::ZoneAllocator::reset(ZoneAllocator *this,Zone *zone)

{
  void *pvVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  DynamicBlock *next;
  DynamicBlock *block;
  void *local_18;
  
  local_18 = (void *)in_RDI[0xb];
  while (local_18 != (void *)0x0) {
    pvVar1 = *(void **)((long)local_18 + 8);
    free(local_18);
    local_18 = pvVar1;
  }
  memset(in_RDI,0,0x60);
  *in_RDI = in_RSI;
  return;
}

Assistant:

void ZoneAllocator::reset(Zone* zone) noexcept {
  // Free dynamic blocks.
  DynamicBlock* block = _dynamicBlocks;
  while (block) {
    DynamicBlock* next = block->next;
    ::free(block);
    block = next;
  }

  // Zero the entire class and initialize to the given `zone`.
  memset(this, 0, sizeof(*this));
  _zone = zone;
}